

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error ignoreSectionProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error result;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  end_local = start;
  start_local = (char *)parser;
  parser_local._4_4_ =
       doIgnoreSection(parser,parser->m_encoding,&end_local,end,endPtr,
                       ((parser->m_parsingStatus).finalBuffer != '\0' ^ 0xffU) & 1);
  if ((parser_local._4_4_ == XML_ERROR_NONE) && (end_local != (char *)0x0)) {
    *(code **)(start_local + 0x220) = prologProcessor;
    parser_local._4_4_ = prologProcessor((XML_Parser)start_local,end_local,end,endPtr);
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
ignoreSectionProcessor(XML_Parser parser, const char *start, const char *end,
                       const char **endPtr) {
  enum XML_Error result
      = doIgnoreSection(parser, parser->m_encoding, &start, end, endPtr,
                        (XML_Bool)! parser->m_parsingStatus.finalBuffer);
  if (result != XML_ERROR_NONE)
    return result;
  if (start) {
    parser->m_processor = prologProcessor;
    return prologProcessor(parser, start, end, endPtr);
  }
  return result;
}